

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O0

double __thiscall
EncoderVelocity::GetEncoderVelocityPredicted(EncoderVelocity *this,double percent_threshold)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_48;
  double predVel;
  double deltaVel;
  double encRun;
  double encDelay;
  double encAcc;
  double encVel;
  double percent_threshold_local;
  EncoderVelocity *this_local;
  
  dVar3 = GetEncoderVelocity(this);
  dVar4 = GetEncoderAcceleration(this,percent_threshold);
  uVar2 = this->velPeriod;
  dVar1 = this->clkPeriod;
  dVar5 = GetEncoderRunningCounterSeconds(this);
  local_48 = dVar3 + dVar4 * (((double)uVar2 * dVar1) / 2.0 + dVar5);
  if (0.0 <= dVar3) {
    if (dVar3 <= 0.0) {
      local_48 = 0.0;
    }
    else {
      if (local_48 < 0.0) {
        local_48 = 0.0;
      }
      if (1.0 < local_48 * dVar5) {
        local_48 = 1.0 / dVar5;
      }
    }
  }
  else {
    if (0.0 < local_48) {
      local_48 = 0.0;
    }
    if (local_48 * dVar5 < -1.0) {
      local_48 = -1.0 / dVar5;
    }
  }
  return local_48;
}

Assistant:

double EncoderVelocity::GetEncoderVelocityPredicted(double percent_threshold) const
{
    double encVel = GetEncoderVelocity();
    double encAcc = GetEncoderAcceleration(percent_threshold);
    // The encoder measurement delay is half the measured period, based on the assumption that measuring the
    // period over a full cycle (4 quadrature counts) estimates the velocity in the middle of that cycle.
    double encDelay = velPeriod*clkPeriod/2.0;
    double encRun = GetEncoderRunningCounterSeconds();
    double deltaVel = encAcc*(encDelay+encRun);
    double predVel = encVel+deltaVel;
    if (encVel < 0) {
        // Do not change velocity direction
        if (predVel > 0.0)
            predVel = 0.0;
        // Maximum velocity limited by 1 count (i.e., we know
        // that a count has not happened for encRun seconds)
        if (predVel*encRun < -1.0)
            predVel = -1.0/encRun;
    }
    else if (encVel > 0.0) {
        // Do not change velocity direction
        if (predVel < 0.0)
            predVel = 0.0;
        // Maximum velocity limited by 1 count (i.e., we know
        // that a count has not happened for encRun seconds)
        if (predVel*encRun > 1.0)
            predVel = 1.0/encRun;
    }
    else {
        // If not moving, do not attempt to predict
        predVel = 0.0;
    }
    return predVel;
}